

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySet.cxx
# Opt level: O1

bool __thiscall
cmInstallRuntimeDependencySet::AddBundleExecutable
          (cmInstallRuntimeDependencySet *this,
          unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
          *bundleExecutable)

{
  Item *pIVar1;
  _Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false> local_10;
  
  pIVar1 = this->BundleExecutable;
  if (pIVar1 == (Item *)0x0) {
    this->BundleExecutable =
         (bundleExecutable->_M_t).
         super___uniq_ptr_impl<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
         .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>._M_head_impl;
    local_10._M_head_impl =
         (bundleExecutable->_M_t).
         super___uniq_ptr_impl<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
         .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>._M_head_impl;
    (bundleExecutable->_M_t).
    super___uniq_ptr_impl<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
    .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>._M_head_impl = (Item *)0x0;
    std::
    vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item,std::default_delete<cmInstallRuntimeDependencySet::Item>>,std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,std::default_delete<cmInstallRuntimeDependencySet::Item>>>>
    ::
    emplace_back<std::unique_ptr<cmInstallRuntimeDependencySet::Item,std::default_delete<cmInstallRuntimeDependencySet::Item>>>
              ((vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item,std::default_delete<cmInstallRuntimeDependencySet::Item>>,std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,std::default_delete<cmInstallRuntimeDependencySet::Item>>>>
                *)&this->Executables,
               (unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
                *)&local_10);
    if (local_10._M_head_impl != (Item *)0x0) {
      (*(local_10._M_head_impl)->_vptr_Item[1])();
    }
  }
  return pIVar1 == (Item *)0x0;
}

Assistant:

bool cmInstallRuntimeDependencySet::AddBundleExecutable(
  std::unique_ptr<Item> bundleExecutable)
{
  if (this->BundleExecutable) {
    return false;
  }
  this->BundleExecutable = bundleExecutable.get();
  this->AddExecutable(std::move(bundleExecutable));
  return true;
}